

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O1

int __thiscall KParser::_if(KParser *this,int begin,BlockInfo *bi)

{
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  uint __val;
  uint uVar4;
  int begin_00;
  int iVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint __len;
  string eLabel;
  string __str;
  long *local_1b0;
  long local_1a0;
  long lStack_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  char local_80 [16];
  undefined1 local_70 [32];
  _Alloc_hider local_50;
  char local_40 [16];
  
  iVar5 = -1;
  if ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_start[begin].tokenType == _if) {
    pcVar2 = (bi->sLabel)._M_dataplus._M_p;
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_70,pcVar2,pcVar2 + (bi->sLabel)._M_string_length);
    pcVar2 = (bi->eLabel)._M_dataplus._M_p;
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (bi->eLabel)._M_string_length);
    begin_00 = _expr(this,begin + 1,(BlockInfo *)local_70);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_);
    }
    if (-1 < begin_00) {
      uVar1 = this->m_labelNumber;
      this->m_labelNumber = uVar1 + 1;
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar9 = (ulong)__val;
        uVar4 = 4;
        do {
          __len = uVar4;
          uVar7 = (uint)uVar9;
          if (uVar7 < 100) {
            __len = __len - 2;
            goto LAB_0010a1aa;
          }
          if (uVar7 < 1000) {
            __len = __len - 1;
            goto LAB_0010a1aa;
          }
          if (uVar7 < 10000) goto LAB_0010a1aa;
          uVar9 = uVar9 / 10000;
          uVar4 = __len + 4;
        } while (99999 < uVar7);
        __len = __len + 1;
      }
LAB_0010a1aa:
      local_190[0] = local_180;
      std::__cxx11::string::_M_construct((ulong)local_190,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_190[0] + (uVar1 >> 0x1f),__len,__val);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_190,0,(char *)0x0,0x11287e);
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_1a0 = *plVar8;
        lStack_198 = plVar6[3];
        local_1b0 = &local_1a0;
      }
      else {
        local_1a0 = *plVar8;
        local_1b0 = (long *)*plVar6;
      }
      lVar3 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if (local_190[0] != local_180) {
        operator_delete(local_190[0]);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"jz","");
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_1b0,lVar3 + (long)local_1b0);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,anon_var_dwarf_16623 + 0x22);
      addCode(this,&local_d0,&local_f0,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      pcVar2 = (bi->sLabel)._M_dataplus._M_p;
      local_b0._0_8_ = local_b0 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_b0,pcVar2,pcVar2 + (bi->sLabel)._M_string_length);
      pcVar2 = (bi->eLabel)._M_dataplus._M_p;
      local_90._M_p = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + (bi->eLabel)._M_string_length);
      iVar5 = _block(this,begin_00,(BlockInfo *)local_b0);
      if (local_90._M_p != local_80) {
        operator_delete(local_90._M_p);
      }
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_);
      }
      if (iVar5 < 0) {
        iVar5 = -1;
      }
      else {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"label","");
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,local_1b0,lVar3 + (long)local_1b0);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,anon_var_dwarf_16623 + 0x22);
        addCode(this,&local_130,&local_150,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
      if (local_1b0 != &local_1a0) {
        operator_delete(local_1b0);
      }
    }
  }
  return iVar5;
}

Assistant:

int KParser::_if(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;
    if( m_tokens[i].tokenType != TokenType::_if ) {
        return -1;
    }
    i++;

    if((t = _expr(i, bi)) < 0) {
        return -1;
    } else {
        i = t;
    } 
    std::string eLabel = "LABEL" + std::to_string(m_labelNumber++);

    addCode("jz", eLabel, "");
    if((t = _block(i, bi)) < 0) {
        return -1;
    } else {
        i = t;
    }
    addCode("label", eLabel, "");
    return i;
}